

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_solve_seq.c
# Opt level: O0

void LP_dgesl(double *a,int lda,int n,int *ipvt,double *b,int job)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double *in_R8;
  int in_R9D;
  double dVar4;
  double dVar5;
  int nm1;
  int l;
  int kb;
  int k;
  double t;
  int local_38;
  int local_34;
  
  iVar2 = in_EDX + -1;
  if (in_R9D == 0) {
    if (0 < iVar2) {
      for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
        iVar1 = *(int *)(in_RCX + (long)local_34 * 4);
        dVar4 = in_R8[iVar1];
        if (iVar1 != local_34) {
          in_R8[iVar1] = in_R8[local_34];
          in_R8[local_34] = dVar4;
        }
        LP_daxpy(in_EDX - (local_34 + 1),dVar4,
                 (double *)(in_RDI + (long)(in_ESI * local_34 + local_34 + 1) * 8),1,
                 in_R8 + (local_34 + 1),1);
      }
    }
    for (local_38 = 0; local_38 < in_EDX; local_38 = local_38 + 1) {
      iVar2 = in_EDX - (local_38 + 1);
      in_R8[iVar2] = in_R8[iVar2] / *(double *)(in_RDI + (long)(in_ESI * iVar2 + iVar2) * 8);
      LP_daxpy(iVar2,-in_R8[iVar2],(double *)(in_RDI + (long)(in_ESI * iVar2) * 8),1,in_R8,1);
    }
  }
  else {
    for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
      dVar4 = LP_ddot(local_34,(double *)(in_RDI + (long)(in_ESI * local_34) * 8),1,in_R8,1);
      in_R8[local_34] =
           (in_R8[local_34] - dVar4) /
           *(double *)(in_RDI + (long)(in_ESI * local_34 + local_34) * 8);
    }
    if (0 < iVar2) {
      for (local_38 = 1; local_38 < iVar2; local_38 = local_38 + 1) {
        iVar3 = in_EDX - (local_38 + 1);
        dVar4 = in_R8[iVar3];
        dVar5 = LP_ddot(in_EDX - (iVar3 + 1),
                        (double *)(in_RDI + (long)(in_ESI * iVar3 + iVar3 + 1) * 8),1,
                        in_R8 + (iVar3 + 1),1);
        in_R8[iVar3] = dVar4 + dVar5;
        iVar1 = *(int *)(in_RCX + (long)iVar3 * 4);
        if (iVar1 != iVar3) {
          dVar4 = in_R8[iVar1];
          in_R8[iVar1] = in_R8[iVar3];
          in_R8[iVar3] = dVar4;
        }
      }
    }
  }
  return;
}

Assistant:

void LP_dgesl(a,lda,n,ipvt,b,job)
int lda,n,ipvt[],job;
REAL a[],b[];

/* We would like to declare a[][lda], but c does not allow it.  In this
function, references to a[i][j] are written a[lda*i+j].  */

/*
     LP_dgesl solves the double precision system
     a * x = b  or  trans(a) * x = b
     using the factors computed by dgeco or LP_dgefa.

     on entry

        a       double precision[n][lda]
                the output from dgeco or LP_dgefa.

        lda     integer
                the leading dimension of the array  a .

        n       integer
                the order of the matrix  a .

        ipvt    integer[n]
                the pivot vector from dgeco or LP_dgefa.

        b       double precision[n]
                the right hand side vector.

        job     integer
                = 0         to solve  a*x = b ,
                = nonzero   to solve  trans(a)*x = b  where
                            trans(a)  is the transpose.

    on return

        b       the solution vector  x .

     error condition

        a division by zero will occur if the input factor contains a
        zero on the diagonal.  technically this indicates singularity
        but it is often caused by improper arguments or improper
        setting of lda .  it will not occur if the subroutines are
        called correctly and if dgeco has set rcond .gt. 0.0
        or LP_dgefa has set info .eq. 0 .

     to compute  inverse(a) * c  where  c  is a matrix
     with  p  columns
           dgeco(a,lda,n,ipvt,rcond,z)
           if (!rcond is too small){
           	for (j=0,j<p,j++)
              		LP_dgesl(a,lda,n,ipvt,c[j][0],0);
	   }

     linpack. this version dated 08/14/78 .
     cleve moler, university of new mexico, argonne national lab.

     functions

     blas LP_daxpy,LP_ddot
*/
{
/*     internal variables	*/

	REAL t;
	int k,kb,l,nm1;

	nm1 = n - 1;
	if (job == 0) {

		/* job = 0 , solve  a * x = b
		   first solve  l*y = b    	*/

		if (nm1 >= 1) {
			for (k = 0; k < nm1; k++) {
				l = ipvt[k];
				t = b[l];
				if (l != k){ 
					b[l] = b[k];
					b[k] = t;
				}	
				LP_daxpy(n-(k+1),t,&a[lda*k+k+1],1,&b[k+1],1);
			}
		} 

		/* now solve  u*x = y */

		for (kb = 0; kb < n; kb++) {
		    k = n - (kb + 1);
		    b[k] = b[k]/a[lda*k+k];
		    t = -b[k];
		    LP_daxpy(k,t,&a[lda*k+0],1,&b[0],1);
		}
	}
	else { 

		/* job = nonzero, solve  trans(a) * x = b
		   first solve  trans(u)*y = b 			*/

		for (k = 0; k < n; k++) {
			t = LP_ddot(k,&a[lda*k+0],1,&b[0],1);
			b[k] = (b[k] - t)/a[lda*k+k];
		}

		/* now solve trans(l)*x = y	*/

		if (nm1 >= 1) {
			for (kb = 1; kb < nm1; kb++) {
				k = n - (kb+1);
				b[k] = b[k] + LP_ddot(n-(k+1),&a[lda*k+k+1],1,&b[k+1],1);
				l = ipvt[k];
				if (l != k) {
					t = b[l];
					b[l] = b[k];
					b[k] = t;
				}
			}
		}
	}
}